

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_t pTabLevel_00;
  aiMaterial *pMat;
  aiReturn aVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  anon_class_16_2_65aab299 *this_01;
  aiString *this_02;
  float fVar4;
  allocator local_915;
  float tvalf;
  anon_class_8_1_15d7a4cc RepeatToAttrList;
  allocator local_901;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  aiColor4D color4;
  undefined1 local_8c8 [8];
  float local_8c0;
  anon_class_16_2_65aab299 Color4ToAttrList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  size_t pIdxMaterial_local;
  string material_name;
  aiString tstring;
  aiString ai_mat_name;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  pMat = this->mScene->mMaterials[pIdxMaterial];
  this_00 = &this->mDEF_Map_Material;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pIdxMaterial_local = pIdxMaterial;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&pIdxMaterial_local);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&ai_mat_name,"USE",(allocator *)&tstring);
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(this_00,&pIdxMaterial_local);
    std::__cxx11::string::string((string *)(ai_mat_name.data + 0x1c),(string *)pmVar3);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)&ai_mat_name);
    SAttribute::~SAttribute((SAttribute *)&ai_mat_name);
    std::__cxx11::string::string((string *)&ai_mat_name,"Appearance",(allocator *)&tstring);
    NodeHelper_OpenNode(this,(string *)&ai_mat_name,pTabLevel,true,&attr_list);
    this_02 = &ai_mat_name;
    goto LAB_00351638;
  }
  std::__cxx11::string::string((string *)&ai_mat_name,"_IDX_",(allocator *)&Color4ToAttrList);
  std::__cxx11::to_string((string *)&tstring,pIdxMaterial_local);
  std::operator+(&material_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ai_mat_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tstring);
  std::__cxx11::string::~string((string *)&tstring);
  std::__cxx11::string::~string((string *)&ai_mat_name);
  ai_mat_name.length = 0;
  ai_mat_name.data[0] = '\0';
  memset(ai_mat_name.data + 1,0x1b,0x3ff);
  aVar1 = aiGetMaterialString(pMat,"?mat.name",0,0,&ai_mat_name);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::insert((ulong)&material_name,(char *)0x0);
  }
  std::__cxx11::string::string((string *)&tstring,"DEF",(allocator *)&Color4ToAttrList);
  std::__cxx11::string::string((string *)(tstring.data + 0x1c),(string *)&material_name);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            (&attr_list,(value_type *)&tstring);
  SAttribute::~SAttribute((SAttribute *)&tstring);
  pmVar3 = std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&pIdxMaterial_local);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::string((string *)&tstring,"Appearance",(allocator *)&Color4ToAttrList);
  NodeHelper_OpenNode(this,(string *)&tstring,pTabLevel,false,&attr_list);
  std::__cxx11::string::~string((string *)&tstring);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
            (&attr_list);
  local_8c8._0_4_ = 0.0;
  local_8c8._4_4_ = 0.0;
  local_8c0 = 0.0;
  color4.r = 0.0;
  color4.g = 0.0;
  color4.b = 0.0;
  color4.a = 0.0;
  Color4ToAttrList.this = this;
  Color4ToAttrList.attr_list = &attr_list;
  aVar1 = aiMaterial::Get(pMat,"$clr.ambient",0,0,(aiColor3D *)local_8c8);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&tstring,"ambientIntensity",(allocator *)&RepeatToAttrList);
    AttrHelper_FloatToAttrList
              (this,&attr_list,(string *)&tstring,
               ((float)local_8c8._0_4_ + (float)local_8c8._4_4_ + local_8c0) / 3.0,0.2);
LAB_00350ef7:
    std::__cxx11::string::~string((string *)&tstring);
  }
  else {
    aVar1 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,&color4);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::string
                ((string *)&tstring,"ambientIntensity",(allocator *)&RepeatToAttrList);
      AttrHelper_FloatToAttrList
                (this,&attr_list,(string *)&tstring,(color4.r + color4.g + color4.b) / 3.0,0.2);
      goto LAB_00350ef7;
    }
  }
  aVar1 = aiMaterial::Get(pMat,"$clr.diffuse",0,0,(aiColor3D *)local_8c8);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&tstring,"diffuseColor",&local_915);
    RepeatToAttrList.attr_list =
         (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
         0x3f4ccccd3f4ccccd;
    AttrHelper_Color3ToAttrList
              (this,&attr_list,(string *)&tstring,(aiColor3D *)local_8c8,
               (aiColor3D *)&RepeatToAttrList);
LAB_00350fd7:
    std::__cxx11::string::~string((string *)&tstring);
  }
  else {
    aVar1 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,&color4);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::string((string *)&tstring,"diffuseColor",&local_915);
      RepeatToAttrList.attr_list =
           (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            *)0x3f4ccccd3f4ccccd;
      Export_Material::anon_class_16_2_65aab299::operator()
                (&Color4ToAttrList,(string *)&tstring,&color4,(aiColor3D *)&RepeatToAttrList);
      goto LAB_00350fd7;
    }
  }
  aVar1 = aiMaterial::Get(pMat,"$clr.emissive",0,0,(aiColor3D *)local_8c8);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&tstring,"emissiveColor",&local_915);
    RepeatToAttrList.attr_list =
         (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
         0x0;
    AttrHelper_Color3ToAttrList
              (this,&attr_list,(string *)&tstring,(aiColor3D *)local_8c8,
               (aiColor3D *)&RepeatToAttrList);
LAB_003510a0:
    std::__cxx11::string::~string((string *)&tstring);
  }
  else {
    aVar1 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,&color4);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::string((string *)&tstring,"emissiveColor",&local_915);
      RepeatToAttrList.attr_list =
           (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            *)0x0;
      Export_Material::anon_class_16_2_65aab299::operator()
                (&Color4ToAttrList,(string *)&tstring,&color4,(aiColor3D *)&RepeatToAttrList);
      goto LAB_003510a0;
    }
  }
  aVar1 = aiGetMaterialFloat(pMat,"$mat.shininess",0,0,&tvalf);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&tstring,"shininess",(allocator *)&RepeatToAttrList);
    AttrHelper_FloatToAttrList(this,&attr_list,(string *)&tstring,tvalf,0.2);
    std::__cxx11::string::~string((string *)&tstring);
  }
  aVar1 = aiMaterial::Get(pMat,"$clr.specular",0,0,(aiColor3D *)local_8c8);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&tstring,"specularColor",&local_915);
    RepeatToAttrList.attr_list =
         (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
         0x0;
    AttrHelper_Color3ToAttrList
              (this,&attr_list,(string *)&tstring,(aiColor3D *)local_8c8,
               (aiColor3D *)&RepeatToAttrList);
LAB_003511ce:
    std::__cxx11::string::~string((string *)&tstring);
  }
  else {
    aVar1 = aiGetMaterialColor(pMat,"$clr.specular",0,0,&color4);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::string((string *)&tstring,"specularColor",&local_915);
      RepeatToAttrList.attr_list =
           (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            *)0x0;
      Export_Material::anon_class_16_2_65aab299::operator()
                (&Color4ToAttrList,(string *)&tstring,&color4,(aiColor3D *)&RepeatToAttrList);
      goto LAB_003511ce;
    }
  }
  aVar1 = aiGetMaterialFloat(pMat,"$mat.opacity",0,0,&tvalf);
  if (aVar1 == aiReturn_SUCCESS) {
    fVar4 = 1.0;
    if (tvalf <= 1.0) {
      fVar4 = tvalf;
    }
    tvalf = 1.0 - fVar4;
    std::__cxx11::string::string((string *)&tstring,"transparency",(allocator *)&RepeatToAttrList);
    AttrHelper_FloatToAttrList(this,&attr_list,(string *)&tstring,tvalf,0.0);
    std::__cxx11::string::~string((string *)&tstring);
  }
  std::__cxx11::string::string((string *)&tstring,"Material",(allocator *)&RepeatToAttrList);
  pTabLevel_00 = pTabLevel + 1;
  NodeHelper_OpenNode(this,(string *)&tstring,pTabLevel_00,true,&attr_list);
  std::__cxx11::string::~string((string *)&tstring);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
            (&attr_list);
  tstring.length = 0;
  tstring.data[0] = '\0';
  RepeatToAttrList.attr_list = &attr_list;
  memset(tstring.data + 1,0x1b,0x3ff);
  aVar1 = aiGetMaterialString(pMat,"$tex.file",1,0,&tstring);
  if (aVar1 == aiReturn_SUCCESS) {
    if (tstring.data[0] == '*') {
      std::__cxx11::string::string
                ((string *)&Color4ToAttrList,"Embedded texture is not supported",
                 (allocator *)&color4);
      LogError(this,(string *)&Color4ToAttrList);
      this_01 = &Color4ToAttrList;
    }
    else {
      std::__cxx11::string::string((string *)&Color4ToAttrList,"url",&local_915);
      std::__cxx11::string::string((string *)local_8c8,"\"",&local_901);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&color4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8,
                     tstring.data);
      std::operator+(&local_888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&color4,
                     "\"");
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back(&attr_list,(value_type *)&Color4ToAttrList);
      SAttribute::~SAttribute((SAttribute *)&Color4ToAttrList);
      std::__cxx11::string::~string((string *)&color4);
      this_01 = (anon_class_16_2_65aab299 *)local_8c8;
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  aVar1 = aiMaterial::Get<bool>(pMat,"$tex.mapmodeu",1,0,(bool *)&tvalf);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&Color4ToAttrList,"repeatS",(allocator *)&color4);
    Export_Material::anon_class_8_1_15d7a4cc::operator()
              (&RepeatToAttrList,(string *)&Color4ToAttrList,tvalf._0_1_);
    std::__cxx11::string::~string((string *)&Color4ToAttrList);
  }
  aVar1 = aiMaterial::Get<bool>(pMat,"$tex.mapmodev",1,0,(bool *)&tvalf);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&Color4ToAttrList,"repeatT",(allocator *)&color4);
    Export_Material::anon_class_8_1_15d7a4cc::operator()
              (&RepeatToAttrList,(string *)&Color4ToAttrList,tvalf._0_1_);
    std::__cxx11::string::~string((string *)&Color4ToAttrList);
  }
  std::__cxx11::string::string((string *)&Color4ToAttrList,"ImageTexture",(allocator *)&color4);
  NodeHelper_OpenNode(this,(string *)&Color4ToAttrList,pTabLevel_00,true,&attr_list);
  std::__cxx11::string::~string((string *)&Color4ToAttrList);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
            (&attr_list);
  Color4ToAttrList.this = (X3DExporter *)0x0;
  Color4ToAttrList.attr_list =
       (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
       0x3f8000003f800000;
  color4._0_8_ = this;
  color4._8_8_ = &attr_list;
  aVar1 = aiGetMaterialUVTransform(pMat,"$tex.uvtrafo",1,0,(aiUVTransform *)&Color4ToAttrList);
  if (aVar1 == aiReturn_SUCCESS) {
    std::__cxx11::string::string((string *)&tstring,"translation",(allocator *)&RepeatToAttrList);
    local_8c8._0_4_ = 0.0;
    local_8c8._4_4_ = 0.0;
    Export_Material::anon_class_16_2_65aab299::operator()
              ((anon_class_16_2_65aab299 *)&color4,(string *)&tstring,
               (aiVector2D *)&Color4ToAttrList,(aiVector2D *)local_8c8);
    std::__cxx11::string::~string((string *)&tstring);
    std::__cxx11::string::string((string *)&tstring,"rotation",(allocator *)local_8c8);
    AttrHelper_FloatToAttrList(this,&attr_list,(string *)&tstring,0.0,0.0);
    std::__cxx11::string::~string((string *)&tstring);
    std::__cxx11::string::string((string *)&tstring,"scale",(allocator *)&RepeatToAttrList);
    local_8c8._0_4_ = 1.0;
    local_8c8._4_4_ = 1.0;
    Export_Material::anon_class_16_2_65aab299::operator()
              ((anon_class_16_2_65aab299 *)&color4,(string *)&tstring,
               (aiVector2D *)&Color4ToAttrList.attr_list,(aiVector2D *)local_8c8);
    std::__cxx11::string::~string((string *)&tstring);
    std::__cxx11::string::string((string *)&tstring,"TextureTransform",(allocator *)local_8c8);
    NodeHelper_OpenNode(this,(string *)&tstring,pTabLevel_00,true,&attr_list);
    std::__cxx11::string::~string((string *)&tstring);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              (&attr_list);
  }
  std::__cxx11::string::string((string *)&tstring,"Appearance",(allocator *)&Color4ToAttrList);
  NodeHelper_CloseNode(this,(string *)&tstring,pTabLevel);
  std::__cxx11::string::~string((string *)&tstring);
  this_02 = (aiString *)&material_name;
LAB_00351638:
  std::__cxx11::string::~string((string *)this_02);
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}